

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_12d03c0::Scenario::CheckExpired(Scenario *this,NodeId peer,GenTxid gtxid)

{
  pointer *pppVar1;
  vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
  *__alloc;
  Runner *pRVar2;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *__first;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *__last;
  size_type __n;
  pointer __result;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar3;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar4;
  undefined8 in_RCX;
  anon_class_88_4_a7d767dc *__args_1;
  long in_FS_OFFSET;
  duration<long,_std::ratio<1L,_1000000L>_> local_90;
  NodeId local_88;
  GenTxid local_80;
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar2 = this->m_runner;
  local_80.m_is_wtxid = gtxid.m_is_wtxid;
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[1] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[1];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[2] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[2];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[3] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[3];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[4] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[4];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[5] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[5];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[6] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[6];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[7] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[7];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[8] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[8];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[9] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[9];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[10] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[10];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0xb];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0xc];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0xd];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0xe];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0xf];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x10];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x11];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x12];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x13];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x14];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x15];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x16];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x17];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x18];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x19];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
  __args_1 = (anon_class_88_4_a7d767dc *)
             CONCAT71((int7)((ulong)in_RCX >> 8),
                      gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
  local_80.m_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
       gtxid.m_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
  local_90.__r = (rep)pRVar2;
  local_88 = peer;
  std::__cxx11::string::string
            (local_58,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &this->m_testname);
  ppVar4 = (pRVar2->actions).
           super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 == (pRVar2->actions).
                super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __alloc = &pRVar2->actions;
    __n = _GLOBAL__N_1::std::
          vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ::_M_check_len(__alloc,1,"vector::_M_realloc_insert");
    __first = (pRVar2->actions).
              super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __last = (pRVar2->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __result = _GLOBAL__N_1::std::
               _Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ::_M_allocate(&__alloc->
                              super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                             ,__n);
    std::
    allocator_traits<std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
    ::
    construct<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::CheckExpired(long,GenTxid)::_lambda()_1_>
              ((allocator_type *)(((long)ppVar4 - (long)__first) + (long)__result),
               (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                *)&this->m_now,&local_90,__args_1);
    ppVar3 = std::
             __relocate_a_1<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
                       (__first,ppVar4,__result,
                        (allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                         *)__alloc);
    ppVar4 = std::
             __relocate_a_1<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>*,std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
                       (ppVar4,__last,ppVar3 + 1,
                        (allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                         *)__alloc);
    _GLOBAL__N_1::std::
    _Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ::_M_deallocate(&__alloc->
                     super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                    ,__first,((long)(pRVar2->actions).
                                    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)__first) / 0x28);
    (pRVar2->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (pRVar2->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
    (pRVar2->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + __n;
  }
  else {
    std::
    allocator_traits<std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
    ::
    construct<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::CheckExpired(long,GenTxid)::_lambda()_1_>
              ((allocator_type *)ppVar4,
               (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                *)&this->m_now,&local_90,__args_1);
    pppVar1 = &(pRVar2->actions).
               super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckExpired(NodeId peer, GenTxid gtxid)
    {
        const auto& testname = m_testname;
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            auto it = runner.expired.find(std::pair<NodeId, GenTxid>{peer, gtxid});
            BOOST_CHECK_MESSAGE(it != runner.expired.end(), "[" + testname + "] missing expiration");
            if (it != runner.expired.end()) runner.expired.erase(it);
        });
    }